

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool enchant2(object *obj,int16_t *score)

{
  ushort uVar1;
  uint32_t uVar2;
  int iVar3;
  
  if ((obj == (object *)0x0) || (uVar2 = Rand_div(100), 0x31 < (int)uVar2)) {
    uVar1 = *score;
    if ((long)(short)uVar1 < 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = 1000;
      if (uVar1 < 0x10) {
        iVar3 = enchant_table[(short)uVar1];
      }
    }
    uVar2 = Rand_div(1000);
    if (iVar3 <= (int)uVar2) {
      *score = *score + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool enchant2(struct object *obj, int16_t *score)
{
	bool result = false;
	bool is_artifact = obj->artifact ? true : false;
	if (enchant_score(score, is_artifact)) result = true;
	return result;
}